

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O2

void __thiscall Neuron_testSpike_Test::~Neuron_testSpike_Test(Neuron_testSpike_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Neuron, testSpike)
{
    Neuron n1;

    n1.spike();
    EXPECT_FALSE(n1.firing());
    EXPECT_TRUE(n1.mem() > 0);

    EXPECT_TRUE(n1.tick(TIME_STEP));
    EXPECT_TRUE(n1.firing());
    EXPECT_TRUE(n1.mem() < 0);

    EXPECT_FALSE(n1.tick(TIME_STEP));
    EXPECT_TRUE(n1.firing());
    EXPECT_TRUE(n1.mem() < 0);

    n1.spike();
    EXPECT_TRUE(n1.mem() > 0);

    EXPECT_TRUE(n1.tick(TIME_STEP));
    EXPECT_TRUE(n1.firing());
    EXPECT_TRUE(n1.mem() < 0);

    for (int i = 0; i < 6; ++i) {
        EXPECT_FALSE(n1.tick(TIME_STEP));
        EXPECT_TRUE(n1.firing());
    }

    EXPECT_FALSE(n1.tick(TIME_STEP));
    EXPECT_FALSE(n1.firing());
}